

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O0

void deqp::gls::StateQueryUtil::queryState
               (ResultCollector *result,CallLogWrapper *gl,QueryType type,GLenum target,
               QueriedState *state)

{
  GLboolean v;
  bool bVar1;
  uchar *puVar2;
  int *piVar3;
  long *plVar4;
  float *pfVar5;
  QueriedState local_138;
  undefined1 local_10c [8];
  StateQueryMemoryWriteGuard<float> value_4;
  undefined1 local_d8 [8];
  StateQueryMemoryWriteGuard<long> value_3;
  undefined1 local_94 [8];
  StateQueryMemoryWriteGuard<int> value_2;
  StateQueryMemoryWriteGuard<unsigned_char> local_5b;
  undefined1 local_58 [5];
  StateQueryMemoryWriteGuard<unsigned_char> value_1;
  GLboolean value;
  QueriedState *state_local;
  GLenum target_local;
  QueryType type_local;
  CallLogWrapper *gl_local;
  ResultCollector *result_local;
  
  switch(type) {
  case QUERY_BOOLEAN:
    StateQueryMemoryWriteGuard<unsigned_char>::StateQueryMemoryWriteGuard(&local_5b);
    puVar2 = StateQueryMemoryWriteGuard<unsigned_char>::operator&(&local_5b);
    glu::CallLogWrapper::glGetBooleanv(gl,target,puVar2);
    bVar1 = checkError(result,gl,"glGetBooleanv");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<unsigned_char>::verifyValidity(&local_5b,result), bVar1))
    {
      puVar2 = StateQueryMemoryWriteGuard::operator_cast_to_unsigned_char_
                         ((StateQueryMemoryWriteGuard *)&local_5b);
      bVar1 = verifyBooleanValidity(result,*puVar2);
      if (bVar1) {
        puVar2 = StateQueryMemoryWriteGuard::operator_cast_to_unsigned_char_
                           ((StateQueryMemoryWriteGuard *)&local_5b);
        QueriedState::QueriedState((QueriedState *)&value_2.m_value,*puVar2 == '\x01');
        memcpy(state,&value_2.m_value,0x28);
      }
    }
    break;
  default:
    break;
  case QUERY_ISENABLED:
    v = glu::CallLogWrapper::glIsEnabled(gl,target);
    bVar1 = checkError(result,gl,"glIsEnabled");
    if ((bVar1) && (bVar1 = verifyBooleanValidity(result,v), bVar1)) {
      QueriedState::QueriedState((QueriedState *)local_58,v == '\x01');
      memcpy(state,local_58,0x28);
    }
    break;
  case QUERY_INTEGER:
    StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int> *)local_94);
    piVar3 = StateQueryMemoryWriteGuard<int>::operator&((StateQueryMemoryWriteGuard<int> *)local_94)
    ;
    glu::CallLogWrapper::glGetIntegerv(gl,target,piVar3);
    bVar1 = checkError(result,gl,"glGetIntegerv");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<int>::verifyValidity
                          ((StateQueryMemoryWriteGuard<int> *)local_94,result), bVar1)) {
      piVar3 = StateQueryMemoryWriteGuard::operator_cast_to_int_
                         ((StateQueryMemoryWriteGuard *)local_94);
      QueriedState::QueriedState((QueriedState *)&value_3.m_postguard,*piVar3);
      memcpy(state,&value_3.m_postguard,0x28);
    }
    break;
  case QUERY_INTEGER64:
    StateQueryMemoryWriteGuard<long>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<long> *)local_d8);
    plVar4 = StateQueryMemoryWriteGuard<long>::operator&
                       ((StateQueryMemoryWriteGuard<long> *)local_d8);
    glu::CallLogWrapper::glGetInteger64v(gl,target,plVar4);
    bVar1 = checkError(result,gl,"glGetInteger64v");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<long>::verifyValidity
                          ((StateQueryMemoryWriteGuard<long> *)local_d8,result), bVar1)) {
      plVar4 = StateQueryMemoryWriteGuard::operator_cast_to_long_
                         ((StateQueryMemoryWriteGuard *)local_d8);
      QueriedState::QueriedState((QueriedState *)&value_4.m_value,*plVar4);
      memcpy(state,&value_4.m_value,0x28);
    }
    break;
  case QUERY_FLOAT:
    StateQueryMemoryWriteGuard<float>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<float> *)local_10c);
    pfVar5 = StateQueryMemoryWriteGuard<float>::operator&
                       ((StateQueryMemoryWriteGuard<float> *)local_10c);
    glu::CallLogWrapper::glGetFloatv(gl,target,pfVar5);
    bVar1 = checkError(result,gl,"glGetFloatv");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<float>::verifyValidity
                          ((StateQueryMemoryWriteGuard<float> *)local_10c,result), bVar1)) {
      pfVar5 = StateQueryMemoryWriteGuard::operator_cast_to_float_
                         ((StateQueryMemoryWriteGuard *)local_10c);
      QueriedState::QueriedState(&local_138,*pfVar5);
      memcpy(state,&local_138,0x28);
    }
  }
  return;
}

Assistant:

void queryState (tcu::ResultCollector& result, glu::CallLogWrapper& gl, QueryType type, glw::GLenum target, QueriedState& state)
{
	switch (type)
	{
		case QUERY_ISENABLED:
		{
			const glw::GLboolean value = gl.glIsEnabled(target);

			if (!checkError(result, gl, "glIsEnabled"))
				return;

			if (!verifyBooleanValidity(result, value))
				return;

			state = QueriedState(value == GL_TRUE);
			break;
		}

		case QUERY_BOOLEAN:
		{
			StateQueryMemoryWriteGuard<glw::GLboolean> value;
			gl.glGetBooleanv(target, &value);

			if (!checkError(result, gl, "glGetBooleanv"))
				return;

			if (!value.verifyValidity(result))
				return;
			if (!verifyBooleanValidity(result, value))
				return;

			state = QueriedState(value == GL_TRUE);
			break;
		}

		case QUERY_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetIntegerv(target, &value);

			if (!checkError(result, gl, "glGetIntegerv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}

		case QUERY_INTEGER64:
		{
			StateQueryMemoryWriteGuard<glw::GLint64> value;
			gl.glGetInteger64v(target, &value);

			if (!checkError(result, gl, "glGetInteger64v"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}

		case QUERY_FLOAT:
		{
			StateQueryMemoryWriteGuard<glw::GLfloat> value;
			gl.glGetFloatv(target, &value);

			if (!checkError(result, gl, "glGetFloatv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
			break;
	}
}